

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_data.cpp
# Opt level: O3

bool __thiscall
duckdb::PreparedStatementData::RequireRebind
          (PreparedStatementData *this,ClientContext *context,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          values)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  BoundParameterData *pBVar4;
  InternalException *this_00;
  size_type parameter_count;
  optional_idx in_R8;
  __node_base *p_Var5;
  __node_base *p_Var6;
  CatalogIdentity catalog_identity;
  CatalogIdentity catalog_identity_00;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  local_58;
  string local_50;
  
  local_58.ptr = values.ptr;
  if (values.ptr ==
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
       *)0x0) {
    parameter_count = 0;
  }
  else {
    optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
    ::CheckValid(&local_58);
    parameter_count = ((local_58.ptr)->_M_h)._M_element_count;
  }
  CheckParameterCount(this,parameter_count);
  if ((this->unbound_statement).
      super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl == (SQLStatement *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Prepared statement without unbound statement","");
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->properties).always_require_rebind != false) {
    return true;
  }
  if ((this->properties).bound_all_parameters != true) {
    return true;
  }
  p_Var5 = &(this->value_map)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
    ::CheckValid(&local_58);
    iVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(local_58.ptr)->_M_h,(key_type *)(p_Var5 + 1));
    optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
    ::CheckValid(&local_58);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
        ._M_cur == (__node_type *)0x0) break;
    pBVar4 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                       ((shared_ptr<duckdb::BoundParameterData,_true> *)(p_Var5 + 5));
    bVar1 = LogicalType::operator==
                      ((LogicalType *)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
                              ._M_cur + 0x28),&pBVar4->return_type);
    if (!bVar1) {
      return true;
    }
  }
  p_Var6 = &(this->properties).read_databases._M_h._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) {
      p_Var6 = &(this->properties).modified_databases._M_h._M_before_begin;
      do {
        p_Var6 = p_Var6->_M_nxt;
        bVar1 = p_Var6 != (__node_base *)0x0;
        if (p_Var6 == (__node_base *)0x0) {
          return bVar1;
        }
        catalog_identity_00.catalog_version.index = in_R8.index;
        catalog_identity_00.catalog_oid = (idx_t)p_Var6[6]._M_nxt;
        bVar2 = CheckCatalogIdentity
                          ((duckdb *)context,(ClientContext *)(p_Var6 + 1),
                           (string *)p_Var6[5]._M_nxt,catalog_identity_00);
      } while (bVar2);
      return bVar1;
    }
    catalog_identity.catalog_version.index = in_R8.index;
    catalog_identity.catalog_oid = (idx_t)p_Var6[6]._M_nxt;
    bVar1 = CheckCatalogIdentity
                      ((duckdb *)context,(ClientContext *)(p_Var6 + 1),(string *)p_Var6[5]._M_nxt,
                       catalog_identity);
  } while (bVar1);
  return true;
}

Assistant:

bool PreparedStatementData::RequireRebind(ClientContext &context,
                                          optional_ptr<case_insensitive_map_t<BoundParameterData>> values) {
	idx_t count = values ? values->size() : 0;
	CheckParameterCount(count);
	if (!unbound_statement) {
		throw InternalException("Prepared statement without unbound statement");
	}
	if (properties.always_require_rebind) {
		// this statement must always be re-bound
		return true;
	}
	if (!properties.bound_all_parameters) {
		// parameters not yet bound: query always requires a rebind
		return true;
	}
	for (auto &it : value_map) {
		auto &identifier = it.first;
		auto lookup = values->find(identifier);
		if (lookup == values->end()) {
			break;
		}
		if (lookup->second.GetValue().type() != it.second->return_type) {
			return true;
		}
	}
	// Check the catalog versions to ensure all catalog entries we rely on are current
	for (auto &it : properties.read_databases) {
		if (!CheckCatalogIdentity(context, it.first, it.second)) {
			return true;
		}
	}
	for (auto &it : properties.modified_databases) {
		if (!CheckCatalogIdentity(context, it.first, it.second)) {
			return true;
		}
	}
	return false;
}